

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O0

int get_string_attr(attr_list l,atom_t attr_id,char **valp)

{
  int iVar1;
  undefined8 *in_RDX;
  int ret;
  attr_union v;
  attr_value_type t;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  attr_value_type *in_stack_ffffffffffffffc8;
  atom_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  iVar1 = query_pattr((attr_list)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                      in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,
                      (attr_union *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else if (in_stack_ffffffffffffffdc == 3) {
    *in_RDX = in_stack_ffffffffffffffc8;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
get_string_attr(attr_list l, atom_t attr_id, char **valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_String:
	*valp = v.u.p;
	break;
    default:
	return 0;
    }
    return 1;
}